

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O1

void __thiscall BMRS<TTA>::PerformLabeling(BMRS<TTA> *this)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Mat1b *pMVar6;
  int *piVar7;
  Mat1i *pMVar8;
  uint *puVar9;
  uint height;
  int iVar10;
  uint64_t *puVar11;
  Run *pRVar12;
  int iVar13;
  uint64_t *puVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint64_t *puVar18;
  int iVar19;
  Run *pRVar20;
  long lVar21;
  ushort uVar22;
  ulong uVar23;
  uint64_t *puVar24;
  uint64_t *puVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar6->field_0x8;
  uVar3 = *(uint *)&pMVar6->field_0xc;
  (this->data_compressed).height = iVar2;
  uVar4 = uVar3 + 0x3f;
  if (-1 < (int)uVar3) {
    uVar4 = uVar3;
  }
  (this->data_compressed).width = uVar3;
  iVar19 = (int)uVar4 >> 6;
  iVar5 = iVar19 + 1;
  (this->data_compressed).data_width = iVar5;
  uVar23 = (long)(iVar5 * iVar2) * 8;
  if (iVar5 * iVar2 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar11 = (uint64_t *)operator_new__(uVar23);
  (this->data_compressed).bits = puVar11;
  InitCompressedData(this,&this->data_compressed);
  uVar16 = iVar2 / 2;
  iVar13 = iVar2 % 2;
  height = uVar16 + iVar13;
  uVar4 = (this->data_compressed).data_width;
  uVar15 = (ulong)uVar4;
  (this->data_merged).height = height;
  (this->data_merged).width = uVar3;
  (this->data_merged).data_width = iVar5;
  uVar23 = (long)(int)(height * iVar5) * 8;
  if ((int)(height * iVar5) < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  puVar11 = (uint64_t *)operator_new__(uVar23);
  (this->data_merged).bits = puVar11;
  if (1 < iVar2) {
    puVar14 = (this->data_compressed).bits;
    lVar17 = (long)(this->data_compressed).data_width;
    puVar24 = puVar14 + lVar17;
    uVar23 = 0;
    puVar25 = puVar11;
    do {
      if (0 < (int)uVar4) {
        uVar26 = 0;
        do {
          puVar25[uVar26] = puVar24[uVar26] | puVar14[uVar26];
          uVar26 = uVar26 + 1;
        } while (uVar15 != uVar26);
      }
      uVar23 = uVar23 + 1;
      puVar25 = puVar25 + (long)iVar19 + 1;
      puVar24 = puVar24 + lVar17 * 2;
      puVar14 = puVar14 + lVar17 * 2;
    } while (uVar23 != uVar16);
  }
  if ((iVar13 != 0) && (0 < (int)uVar4)) {
    iVar10 = (this->data_compressed).data_width;
    puVar24 = (this->data_compressed).bits;
    uVar23 = 0;
    do {
      puVar11[(long)(int)uVar16 * (long)iVar5 + uVar23] =
           puVar24[(long)iVar10 * (long)(iVar2 + -1) + uVar23];
      uVar23 = uVar23 + 1;
    } while (uVar15 != uVar23);
  }
  (this->data_flags).height = height - 1;
  (this->data_flags).width = uVar3;
  (this->data_flags).data_width = iVar5;
  iVar10 = (height - 1) * iVar5;
  uVar23 = 0xffffffffffffffff;
  if (-1 < iVar10) {
    uVar23 = (long)iVar10 * 8;
  }
  puVar11 = (uint64_t *)operator_new__(uVar23);
  (this->data_flags).bits = puVar11;
  lVar17 = (long)(this->data_flags).height;
  if (0 < lVar17) {
    puVar14 = (this->data_compressed).bits;
    lVar21 = (long)(this->data_compressed).data_width;
    puVar24 = puVar14 + lVar21;
    lVar27 = 0;
    puVar18 = puVar11;
    puVar25 = puVar14;
    do {
      puVar25 = puVar25 + lVar21 * 2;
      puVar11[lVar27 * iVar5] =
           (puVar14[(lVar27 * 2 + 2) * lVar21] * 2 | puVar14[(lVar27 * 2 + 2) * lVar21]) &
           (puVar14[(lVar27 * 2 + 1) * lVar21] * 2 | puVar14[(lVar27 * 2 + 1) * lVar21]);
      if (1 < (int)uVar4) {
        uVar23 = 1;
        do {
          puVar18[uVar23] =
               (puVar25[uVar23 - 1] >> 0x3f | puVar25[uVar23] << 1 | puVar25[uVar23]) &
               (puVar24[uVar23 - 1] >> 0x3f | puVar24[uVar23] << 1 | puVar24[uVar23]);
          uVar23 = uVar23 + 1;
        } while (uVar15 != uVar23);
      }
      lVar27 = lVar27 + 1;
      puVar18 = puVar18 + (long)iVar19 + 1;
      puVar24 = puVar24 + lVar21 * 2;
    } while (lVar27 != lVar17);
  }
  (this->data_runs).height = height;
  (this->data_runs).width = uVar3;
  pRVar12 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar12;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar5 = *(int *)&pMVar6->field_0x8;
  iVar19 = *(int *)&pMVar6->field_0xc;
  TTA::Alloc(((iVar19 - (iVar19 + 1 >> 0x1f)) + 1 >> 1) * ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) +
             1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,height,uVar4,(this->data_runs).runs
          );
  piVar7 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar7,piVar7[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pRVar12 = (this->data_runs).runs;
  if (1 < iVar2) {
    pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar11 = (this->data_compressed).bits;
    lVar21 = *(long *)&pMVar8->field_0x10;
    lVar27 = **(long **)&pMVar8->field_0x48;
    lVar17 = lVar21 + lVar27;
    lVar27 = lVar27 * 2;
    uVar23 = 0;
    do {
      puVar9 = TTA::rtable_;
      iVar5 = (this->data_compressed).data_width;
      iVar19 = (int)uVar23 * iVar5;
      pRVar20 = pRVar12;
      do {
        uVar22 = pRVar20->start_pos;
        uVar15 = (ulong)uVar22;
        if (uVar15 == 0xffff) {
          pRVar12 = pRVar20 + 1;
        }
        else {
          uVar1 = pRVar20->end_pos;
          pRVar12 = pRVar20;
          if (uVar22 < uVar1) {
            uVar3 = puVar9[pRVar20->label];
            do {
              uVar26 = uVar15 >> 6 & 0x3ffffff;
              if ((puVar11[(long)(iVar19 * 2) + uVar26] >> (uVar15 & 0x3f) & 1) != 0) {
                *(uint *)(lVar21 + uVar15 * 4) = uVar3;
              }
              if ((puVar11[(long)(iVar19 * 2) + (long)iVar5 + uVar26] & 1L << ((byte)uVar15 & 0x3f))
                  != 0) {
                *(uint *)(lVar17 + uVar15 * 4) = uVar3;
              }
              uVar15 = uVar15 + 1;
            } while (uVar1 != uVar15);
          }
        }
        pRVar20 = pRVar12 + 1;
      } while (uVar22 != 0xffff);
      uVar23 = uVar23 + 1;
      lVar17 = lVar17 + lVar27;
      lVar21 = lVar21 + lVar27;
    } while (uVar23 != uVar16);
  }
  puVar9 = TTA::rtable_;
  if (iVar13 != 0) {
    uVar22 = pRVar12->start_pos;
    bVar28 = uVar22 == 0xffff;
    if (!bVar28) {
      pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar17 = **(long **)&pMVar8->field_0x48;
      lVar21 = *(long *)&pMVar8->field_0x10;
      do {
        uVar1 = pRVar12->end_pos;
        if (uVar22 < uVar1) {
          uVar3 = puVar9[pRVar12->label];
          uVar23 = (ulong)uVar22;
          do {
            *(uint *)((iVar2 + -1) * lVar17 + lVar21 + uVar23 * 4) = uVar3;
            uVar23 = uVar23 + 1;
          } while (uVar1 != uVar23);
        }
        if (bVar28) break;
        uVar22 = pRVar12[1].start_pos;
        pRVar12 = pRVar12 + 1;
        bVar28 = uVar22 == 0xffff;
      } while (!bVar28);
    }
  }
  TTA::Dealloc();
  pRVar12 = (this->data_runs).runs;
  if (pRVar12 != (Run *)0x0) {
    operator_delete__(pRVar12);
  }
  puVar11 = (this->data_flags).bits;
  if (puVar11 != (uint64_t *)0x0) {
    operator_delete__(puVar11);
  }
  puVar11 = (this->data_merged).bits;
  if (puVar11 != (uint64_t *)0x0) {
    operator_delete__(puVar11);
  }
  puVar11 = (this->data_compressed).bits;
  if (puVar11 != (uint64_t *)0x0) {
    operator_delete__(puVar11);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        data_merged.Alloc(h_merge, w);
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        data_flags.Alloc(h_merge - 1, w);
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        //find runs
        data_runs.Alloc(h_merge, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);

        img_labels_ = cv::Mat1i(img_.size(), 0);    // (0-init)

        // New version (uses 1-byte per pixel input)
        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }


        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_flags.Dealloc();
        data_merged.Dealloc();
        data_compressed.Dealloc();
    }